

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::SetupAddressRelay
          (PeerManagerImpl *this,CNode *node,Peer *peer)

{
  byte bVar1;
  int iVar2;
  __uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> __p;
  long in_FS_OFFSET;
  undefined4 local_2c;
  __uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)&(this->m_peer_map)._M_t._M_impl.field_0x4;
  if (iVar2 != 4) {
    LOCK();
    bVar1 = (node->addr).super_CService.super_CNetAddr.m_addr._union.direct[0];
    (node->addr).super_CService.super_CNetAddr.m_addr._union.direct[0] = '\x01';
    UNLOCK();
    if ((bVar1 & 1) == 0) {
      local_2c = 5000;
      std::make_unique<CRollingBloomFilter,int,double>((int *)&local_28,(double *)&local_2c);
      __p._M_t.
      super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
      super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl =
           local_28._M_t.
           super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
           super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
      local_28._M_t.
      super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
      super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl =
           (tuple<CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>)
           (_Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>)0x0;
      std::__uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::reset
                ((__uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
                 &node->m_connected,
                 (pointer)__p._M_t.
                          super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>
                          .super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl);
      std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::~unique_ptr
                ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
                 &local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2 != 4;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::SetupAddressRelay(const CNode& node, Peer& peer)
{
    // We don't participate in addr relay with outbound block-relay-only
    // connections to prevent providing adversaries with the additional
    // information of addr traffic to infer the link.
    if (node.IsBlockOnlyConn()) return false;

    if (!peer.m_addr_relay_enabled.exchange(true)) {
        // During version message processing (non-block-relay-only outbound peers)
        // or on first addr-related message we have received (inbound peers), initialize
        // m_addr_known.
        peer.m_addr_known = std::make_unique<CRollingBloomFilter>(5000, 0.001);
    }

    return true;
}